

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

void * Thread::localStart(void *arg)

{
  int iVar1;
  EventLoop *this;
  bool bVar2;
  int iVar3;
  Event *pEVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  EventLoop *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  (**(code **)(*arg + 0x10))();
  EventLoop::cleanupLocalEventLoop();
  bVar2 = isAutoDelete((Thread *)arg);
  if (!bVar2) {
    return (void *)0x0;
  }
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)arg + 0x50);
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001669d2:
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    iVar3 = this_00->_M_use_count;
    do {
      if (iVar3 == 0) goto LAB_001669d2;
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar2 = iVar3 == iVar1;
      if (bVar2) {
        this_00->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar2);
    this = *(EventLoop **)((long)arg + 0x48);
    if (this != (EventLoop *)0x0 && this_00->_M_use_count != 0) {
      pEVar4 = (Event *)operator_new(0x28);
      pEVar4->_vptr_Event = (_func_int **)&PTR__Event_001906f8;
      pEVar4[1]._vptr_Event = (_func_int **)finish;
      pEVar4[2]._vptr_Event = (_func_int **)0x0;
      pEVar4[3]._vptr_Event = (_func_int **)arg;
      EventLoop::post(this,pEVar4);
      goto LAB_00166a2e;
    }
  }
  EventLoop::mainEventLoop();
  pEVar4 = (Event *)operator_new(0x28);
  pEVar4->_vptr_Event = (_func_int **)&PTR__Event_001906f8;
  pEVar4[1]._vptr_Event = (_func_int **)finish;
  pEVar4[2]._vptr_Event = (_func_int **)0x0;
  pEVar4[3]._vptr_Event = (_func_int **)arg;
  EventLoop::post(local_28,pEVar4);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return (void *)0x0;
  }
LAB_00166a2e:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return (void *)0x0;
}

Assistant:

void* Thread::localStart(void* arg)
{
    Thread* t = static_cast<Thread*>(arg);
    t->run();
    EventLoop::cleanupLocalEventLoop();
    if (t->isAutoDelete()) {
        if (EventLoop::SharedPtr loop = t->mLoop.lock())
            loop->callLater(std::bind(&Thread::finish, t));
        else
            EventLoop::mainEventLoop()->callLater(std::bind(&Thread::finish, t));
    }
    return 0;
}